

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I210ToAR30Row_C(uint16_t *src_y,uint16_t *src_u,uint16_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  int *in_R8;
  uint in_R9D;
  YuvConstants *unaff_retaddr;
  int r;
  int g;
  int b;
  int x;
  int *r_00;
  uint8_t *in_stack_ffffffffffffffc0;
  int local_30;
  int16_t v;
  int16_t u;
  int16_t y;
  
  for (local_30 = 0; v = (int16_t)((ulong)in_RSI >> 0x10), u = (int16_t)((ulong)in_RSI >> 0x20),
      y = (int16_t)((ulong)in_RSI >> 0x30), local_30 < (int)(in_R9D - 1); local_30 = local_30 + 2) {
    r_00 = in_R8;
    libyuv::YuvPixel16(y,u,v,in_RDX,in_RCX,in_R8,unaff_retaddr);
    libyuv::StoreAR30(in_stack_ffffffffffffffc0,(int)((ulong)in_R8 >> 0x20),(int)in_R8,0);
    in_R8 = r_00;
    libyuv::YuvPixel16((int16_t)((ulong)in_RSI >> 0x30),(int16_t)((ulong)in_RSI >> 0x20),
                       (int16_t)((ulong)in_RSI >> 0x10),in_RDX,in_RCX,r_00,unaff_retaddr);
    libyuv::StoreAR30(in_stack_ffffffffffffffc0,(int)((ulong)r_00 >> 0x20),(int)r_00,0);
    in_RSI = in_RSI + 2;
    in_RDX = (int *)((long)in_RDX + 2);
    in_RCX = in_RCX + 2;
  }
  if ((in_R9D & 1) != 0) {
    libyuv::YuvPixel16(y,u,v,in_RDX,in_RCX,in_R8,unaff_retaddr);
    libyuv::StoreAR30(in_stack_ffffffffffffffc0,(int)((ulong)in_R8 >> 0x20),(int)in_R8,0);
  }
  return;
}

Assistant:

void I210ToAR30Row_C(const uint16_t* src_y,
                     const uint16_t* src_u,
                     const uint16_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  int b;
  int g;
  int r;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
    YuvPixel16(src_y[1], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf + 4, b, g, r);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
  }
}